

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O2

VOID LeaveCriticalSection(LPCRITICAL_SECTION lpCriticalSection)

{
  CPalThread *pThread;
  
  if (PAL_InitializeChakraCoreCalled) {
    pThread = CorUnix::InternalGetCurrentThread();
    CorUnix::InternalLeaveCriticalSection(pThread,lpCriticalSection);
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

VOID LeaveCriticalSection(LPCRITICAL_SECTION lpCriticalSection)
{
    PERF_ENTRY(LeaveCriticalSection);
    ENTRY("LeaveCriticalSection(lpCriticalSection=%p)\n", lpCriticalSection);

    CPalThread * pThread = InternalGetCurrentThread();

    InternalLeaveCriticalSection(pThread, lpCriticalSection);

    LOGEXIT("LeaveCriticalSection returns void\n");
    PERF_EXIT(LeaveCriticalSection);
}